

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

void hash_table_empty(hash_table_t *h)

{
  hash_entry_s *phVar1;
  int local_24;
  int32 i;
  hash_entry_t *e2;
  hash_entry_t *e;
  hash_table_t *h_local;
  
  for (local_24 = 0; local_24 < h->size; local_24 = local_24 + 1) {
    e2 = h->table[local_24].next;
    while (e2 != (hash_entry_t *)0x0) {
      phVar1 = e2->next;
      ckd_free(e2);
      e2 = phVar1;
    }
    memset(h->table + local_24,0,0x20);
  }
  h->inuse = 0;
  return;
}

Assistant:

void
hash_table_empty(hash_table_t *h)
{
    hash_entry_t *e, *e2;
    int32 i;

    for (i = 0; i < h->size; i++) {
        /* Free collision lists. */
        for (e = h->table[i].next; e; e = e2) {
            e2 = e->next;
            ckd_free((void *) e);
        }
        memset(&h->table[i], 0, sizeof(h->table[i]));
    }
    h->inuse = 0;
}